

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O3

unsigned_long __thiscall
libdivide::divider<unsigned_long,_(libdivide::Branching)1>::recover
          (divider<unsigned_long,_(libdivide::Branching)1> *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  byte bVar4;
  ulong uVar5;
  unsigned_long uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  
  uVar1 = (this->div).denom.magic;
  bVar4 = (this->div).denom.more & 0x3f;
  if (uVar1 == 0) {
    uVar6 = 1L << ((ulong)(byte)(bVar4 + 1) & 0x3f);
  }
  else {
    uVar10 = 1;
    lVar8 = 1L << bVar4;
    auVar11 = __udivti3(0,lVar8,uVar1,1);
    uVar5 = auVar11._0_8_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar1;
    lVar7 = SUB168(auVar2 * auVar3,0);
    uVar9 = ((lVar8 - (auVar11._8_8_ * uVar1 + uVar5 + SUB168(auVar2 * auVar3,8))) -
            (ulong)(lVar7 != 0)) * 2 | (ulong)-lVar7 >> 0x3f;
    if (uVar9 < 2) {
      uVar10 = (ulong)(uVar1 <= (ulong)(lVar7 * -2) && uVar9 == 1);
    }
    uVar6 = uVar10 + 1 + uVar5 * 2;
  }
  return uVar6;
}

Assistant:

T recover() const { return div.recover(); }